

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O3

SizedPtr google::protobuf::internal::anon_unknown_12::AllocateBlock
                   (AllocationPolicy *policy_ptr,size_t last_size,size_t min_bytes)

{
  ulong uVar1;
  size_t *psVar2;
  ulong uVar3;
  void *pvVar4;
  AllocationPolicy *policy;
  SizedPtr SVar5;
  
  if (policy_ptr == (AllocationPolicy *)0x0) {
    uVar1 = 0x8000;
    uVar3 = 0x100;
    policy = (AllocationPolicy *)0x0;
  }
  else {
    uVar3 = policy_ptr->start_block_size;
    uVar1 = policy_ptr->max_block_size;
    policy = (AllocationPolicy *)policy_ptr->block_alloc;
  }
  if (min_bytes < 0xfffffffffffffff0) {
    if (last_size * 2 < uVar1) {
      uVar1 = last_size * 2;
    }
    if (last_size == 0) {
      uVar1 = uVar3;
    }
    uVar3 = min_bytes + 0x10;
    if (min_bytes + 0x10 < uVar1) {
      uVar3 = uVar1;
    }
    SVar5 = AllocateMemory(policy,uVar3);
    return SVar5;
  }
  _GLOBAL__N_1::AllocateBlock();
  psVar2 = (size_t *)__tls_get_addr(&PTR_001b3f20);
  pvVar4 = (void *)*psVar2;
  if ((char)pvVar4 == '\0') {
    LOCK();
    UNLOCK();
    pvVar4 = (void *)(ThreadSafeArena::lifecycle_id_ << 8);
    ThreadSafeArena::lifecycle_id_ = ThreadSafeArena::lifecycle_id_ + 1;
  }
  *psVar2 = (long)pvVar4 + 1U;
  SVar5.n = (long)pvVar4 + 1U;
  SVar5.p = pvVar4;
  return SVar5;
}

Assistant:

SizedPtr AllocateBlock(const AllocationPolicy* policy_ptr, size_t last_size,
                       size_t min_bytes) {
  AllocationPolicy policy;  // default policy
  if (policy_ptr) policy = *policy_ptr;
  size_t size =
      AllocationSize(last_size, policy.start_block_size, policy.max_block_size);
  // Verify that min_bytes + kBlockHeaderSize won't overflow.
  ABSL_CHECK_LE(min_bytes, std::numeric_limits<size_t>::max() -
                               SerialArena::kBlockHeaderSize);
  size = std::max(size, SerialArena::kBlockHeaderSize + min_bytes);

  return AllocateMemory(policy, size);
}